

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::util_anPrDuDgn(HModel *this)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int row;
  uint uVar4;
  ulong uVar5;
  int var;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_48;
  
  dVar7 = this->dblOption[1];
  dVar1 = this->dblOption[2];
  local_48 = 0.0;
  uVar3 = 0;
  for (uVar5 = 0; (long)uVar5 < (long)this->numRow; uVar5 = uVar5 + 1) {
    dVar6 = (this->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5];
    local_48 = local_48 + dVar6 * dVar6;
    dVar8 = (this->baseLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5] - dVar6;
    dVar6 = dVar6 - (this->baseUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
    if (dVar6 <= dVar8) {
      dVar6 = dVar8;
    }
    uVar3 = uVar3 + (ABS(dVar6) < dVar7);
    printf("Basic variable %7d is %7d: [%11.4g, %11.4g, %11.4g] Rsdu = %11.4g; numDgnPrAct = %7d\n",
           uVar5 & 0xffffffff,
           (ulong)(uint)(this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar5],(ulong)uVar3);
  }
  if (local_48 < 0.0) {
    local_48 = sqrt(local_48);
  }
  else {
    local_48 = SQRT(local_48);
  }
  dVar7 = 0.0;
  iVar2 = this->numRow;
  uVar4 = 0;
  for (uVar5 = 0; (long)uVar5 < (long)this->numTot; uVar5 = uVar5 + 1) {
    if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] == 1) {
      dVar6 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      dVar7 = dVar7 + dVar6 * dVar6;
      uVar4 = uVar4 + (ABS(dVar6) < dVar1);
      printf("Variable %7d is nonbasic: %11.4g; numDgnDuAct = %7d\n",uVar5 & 0xffffffff,(ulong)uVar4
            );
    }
  }
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  printf("anPrDuDgn: model %s: ||BcPrAct|| = %g; numDgnPrAct = %d of %d (%7.2f%%); ||NonBcDuAct|| = %g; numDgnDuAct = %d of %d (%7.2f%%)\n"
         ,local_48,((double)(int)uVar3 * 100.0) / (double)iVar2,dVar7,
         ((double)(int)uVar4 * 100.0) / (double)this->numCol,(this->modelName)._M_dataplus._M_p,
         (ulong)uVar3,(ulong)(uint)this->numRow,(ulong)uVar4);
  printf("GrepAnPrDuDgn,%s,%g,%d,%d,%g,%d,%d\n",local_48,dVar7,(this->modelName)._M_dataplus._M_p,
         (ulong)uVar3,(ulong)(uint)this->numRow,(ulong)uVar4,(ulong)(uint)this->numCol);
  return;
}

Assistant:

void HModel::util_anPrDuDgn() {
  double normPrAct = 0;
  int numDgnPrAct = 0;
  double normDuAct = 0;
  int numDgnDuAct = 0;
  double TlPrIfs = dblOption[DBLOPT_PRIMAL_TOL];
  double TlDuIfs = dblOption[DBLOPT_DUAL_TOL];
  for (int row=0; row < numRow; row++) {
    double prAct = baseValue[row];
    normPrAct += prAct*prAct;
    double rsdu = max(baseLower[row]-prAct, prAct-baseUpper[row]);
    if (abs(rsdu) < TlPrIfs) {numDgnPrAct++;}
    printf("Basic variable %7d is %7d: [%11.4g, %11.4g, %11.4g] Rsdu = %11.4g; numDgnPrAct = %7d\n",
	   row, basicIndex[row], baseLower[row], prAct, baseUpper[row], rsdu, numDgnPrAct);
  }
  normPrAct = sqrt(normPrAct);
  double pctDgnPrAct = numDgnPrAct;
  pctDgnPrAct = 100*pctDgnPrAct/numRow;

  for (int var=0; var < numTot; var++) {
    if (nonbasicFlag[var] == NONBASIC_FLAG_TRUE) {
      double duAct = workDual[var];
      normDuAct += duAct*duAct;
      if (abs(duAct) < TlDuIfs) {numDgnDuAct++;}
      printf("Variable %7d is nonbasic: %11.4g; numDgnDuAct = %7d\n", var, duAct, numDgnDuAct);
    }
  }
  normDuAct = sqrt(normDuAct);
  double pctDgnDuAct = numDgnDuAct;
  pctDgnDuAct = 100*pctDgnDuAct/numCol;

  printf("anPrDuDgn: model %s: ||BcPrAct|| = %g; numDgnPrAct = %d of %d (%7.2f%%); ||NonBcDuAct|| = %g; numDgnDuAct = %d of %d (%7.2f%%)\n",
	 modelName.c_str(), normPrAct, numDgnPrAct, numRow, pctDgnPrAct, normDuAct, numDgnDuAct, numCol, pctDgnDuAct);
  printf("GrepAnPrDuDgn,%s,%g,%d,%d,%g,%d,%d\n",
	 modelName.c_str(), normPrAct, numDgnPrAct, numRow, normDuAct, numDgnDuAct, numCol);
  
}